

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest::iterate
          (MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = 0;
  do {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1390))
              (0x9100,1,*(undefined4 *)((long)&DAT_01af74f8 + lVar3),1,1,1);
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
    if (iVar2 != 0x500) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid error code reported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                 ,0x1f6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest::iterate()
{
	/* Test case variables */
	const glw::GLboolean  fixedsamplelocations = GL_TRUE;
	const glw::Functions& gl				   = m_context.getRenderContext().getFunctions();
	const glw::GLsizei	height			   = 1;
	/* GL_SRGB8_ALPHA8 is renderable according to spec - replaced with GL_SRGB8 */
	/* GL_RGBA32F is renderable if EXT_color_buffer_float extension is supported - replaced with GL_RGB32F */
	/* GL_SRGB8 is renderable if extension NV_sRGB_formats is supported. */
	/* GL_R8_SNORM is renderable if extension EXT_render_snorm is supported - replace with GL_RGB8_SNORM*/
	const glw::GLenum  internalformats_list[]	 = { GL_RGB8_SNORM, GL_RGB32F, GL_RGB32I };
	const int		   internalformats_list_count = sizeof(internalformats_list) / sizeof(internalformats_list[0]);
	const glw::GLsizei samples					  = 1;
	const glw::GLenum  target					  = GL_TEXTURE_2D_MULTISAMPLE;
	const glw::GLsizei width					  = 1;

	/* Iterate through all internal formats test case should check */
	for (int i = 0; i < internalformats_list_count; i++)
	{
		/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
		initInternalIteration();

		/* Issue call with valid parameters, but invalid internalformats */
		gl.texStorage2DMultisample(target, samples, internalformats_list[i], width, height, fixedsamplelocations);

		/* Check if the expected error code was reported */
		if (gl.getError() != GL_INVALID_ENUM)
		{
			TCU_FAIL("Invalid error code reported");
		}

		/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
		deinitInternalIteration();
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}